

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  byte bVar23;
  long lVar24;
  long lVar25;
  byte bVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined4 uVar70;
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [32];
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong *local_2880;
  undefined1 local_2840 [16];
  long local_2828;
  Scene *local_2820;
  long local_2818;
  RTCFilterFunctionNArguments local_2810;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2710 [16];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  RTCHitN local_2690 [16];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined4 local_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  uint local_2620;
  uint uStack_261c;
  uint uStack_2618;
  uint uStack_2614;
  uint uStack_2610;
  uint uStack_260c;
  uint uStack_2608;
  uint uStack_2604;
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  local_2880 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  local_2740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar99 = ZEXT3264(local_2740);
  local_2760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar100 = ZEXT3264(local_2760);
  local_2780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar101 = ZEXT3264(local_2780);
  fVar71 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar79 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_27a0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar71 * 0.99999964)));
  auVar102 = ZEXT3264(local_27a0);
  local_27c0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar79 * 0.99999964)));
  auVar103 = ZEXT3264(local_27c0);
  local_27e0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar87 * 0.99999964)));
  auVar104 = ZEXT3264(local_27e0);
  fVar71 = fVar71 * 1.0000004;
  fVar79 = fVar79 * 1.0000004;
  fVar87 = fVar87 * 1.0000004;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar2 = (tray->tnear).field_0.i[k];
  local_2600._4_4_ = iVar2;
  local_2600._0_4_ = iVar2;
  local_2600._8_4_ = iVar2;
  local_2600._12_4_ = iVar2;
  local_2600._16_4_ = iVar2;
  local_2600._20_4_ = iVar2;
  local_2600._24_4_ = iVar2;
  local_2600._28_4_ = iVar2;
  auVar94 = ZEXT3264(local_2600);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar63 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_2710 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar95 = ZEXT3264(_DAT_01fe9900);
  auVar97 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  local_25a0 = fVar71;
  fStack_259c = fVar71;
  fStack_2598 = fVar71;
  fStack_2594 = fVar71;
  fStack_2590 = fVar71;
  fStack_258c = fVar71;
  fStack_2588 = fVar71;
  fStack_2584 = fVar71;
  local_25c0 = fVar79;
  fStack_25bc = fVar79;
  fStack_25b8 = fVar79;
  fStack_25b4 = fVar79;
  fStack_25b0 = fVar79;
  fStack_25ac = fVar79;
  fStack_25a8 = fVar79;
  fStack_25a4 = fVar79;
  local_25e0 = fVar87;
  fStack_25dc = fVar87;
  fStack_25d8 = fVar87;
  fStack_25d4 = fVar87;
  fStack_25d0 = fVar87;
  fStack_25cc = fVar87;
  fStack_25c8 = fVar87;
  fStack_25c4 = fVar87;
  fVar73 = fVar71;
  fVar74 = fVar71;
  fVar75 = fVar71;
  fVar76 = fVar71;
  fVar77 = fVar71;
  fVar78 = fVar71;
  fVar81 = fVar79;
  fVar82 = fVar79;
  fVar83 = fVar79;
  fVar84 = fVar79;
  fVar85 = fVar79;
  fVar86 = fVar79;
  fVar88 = fVar87;
  fVar89 = fVar87;
  fVar90 = fVar87;
  fVar91 = fVar87;
  fVar92 = fVar87;
  fVar93 = fVar87;
  do {
    pfVar1 = (float *)(local_2880 + -1);
    local_2880 = local_2880 + -2;
    if (*pfVar1 <= *(float *)(ray + k * 4 + 0x80)) {
      uVar33 = *local_2880;
      while ((uVar33 & 8) == 0) {
        auVar36 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar31),auVar99._0_32_);
        auVar36 = vmulps_avx512vl(auVar102._0_32_,auVar36);
        auVar37 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar32),auVar100._0_32_);
        auVar37 = vmulps_avx512vl(auVar103._0_32_,auVar37);
        auVar36 = vmaxps_avx(auVar36,auVar37);
        auVar37 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar29),auVar101._0_32_);
        auVar37 = vmulps_avx512vl(auVar104._0_32_,auVar37);
        auVar37 = vmaxps_avx(auVar37,auVar94._0_32_);
        auVar36 = vmaxps_avx(auVar36,auVar37);
        auVar38 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar31 ^ 0x20)),
                                  auVar99._0_32_);
        auVar37._4_4_ = fVar73 * auVar38._4_4_;
        auVar37._0_4_ = fVar71 * auVar38._0_4_;
        auVar37._8_4_ = fVar74 * auVar38._8_4_;
        auVar37._12_4_ = fVar75 * auVar38._12_4_;
        auVar37._16_4_ = fVar76 * auVar38._16_4_;
        auVar37._20_4_ = fVar77 * auVar38._20_4_;
        auVar37._24_4_ = fVar78 * auVar38._24_4_;
        auVar37._28_4_ = auVar38._28_4_;
        auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar32 ^ 0x20)),
                                  auVar100._0_32_);
        auVar38._4_4_ = fVar81 * auVar39._4_4_;
        auVar38._0_4_ = fVar79 * auVar39._0_4_;
        auVar38._8_4_ = fVar82 * auVar39._8_4_;
        auVar38._12_4_ = fVar83 * auVar39._12_4_;
        auVar38._16_4_ = fVar84 * auVar39._16_4_;
        auVar38._20_4_ = fVar85 * auVar39._20_4_;
        auVar38._24_4_ = fVar86 * auVar39._24_4_;
        auVar38._28_4_ = auVar39._28_4_;
        auVar37 = vminps_avx(auVar37,auVar38);
        auVar38 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar29 ^ 0x20)),
                                  auVar101._0_32_);
        auVar39._4_4_ = fVar88 * auVar38._4_4_;
        auVar39._0_4_ = fVar87 * auVar38._0_4_;
        auVar39._8_4_ = fVar89 * auVar38._8_4_;
        auVar39._12_4_ = fVar90 * auVar38._12_4_;
        auVar39._16_4_ = fVar91 * auVar38._16_4_;
        auVar39._20_4_ = fVar92 * auVar38._20_4_;
        auVar39._24_4_ = fVar93 * auVar38._24_4_;
        auVar39._28_4_ = auVar38._28_4_;
        auVar38 = vminps_avx(auVar39,auVar63._0_32_);
        auVar37 = vminps_avx(auVar37,auVar38);
        uVar34 = vcmpps_avx512vl(auVar36,auVar37,2);
        bVar23 = (byte)uVar34;
        if (bVar23 == 0) goto LAB_007a0c85;
        auVar37 = *(undefined1 (*) [32])(uVar33 & 0xfffffffffffffff0);
        auVar38 = ((undefined1 (*) [32])(uVar33 & 0xfffffffffffffff0))[1];
        auVar39 = vpternlogd_avx512vl(auVar95._0_32_,auVar36,auVar97._0_32_,0xf8);
        auVar40 = vpcompressd_avx512vl(auVar39);
        auVar41._0_4_ =
             (uint)(bVar23 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar39._0_4_;
        bVar9 = (bool)((byte)(uVar34 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar39._4_4_;
        bVar9 = (bool)((byte)(uVar34 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * auVar39._8_4_;
        bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar9 * auVar40._12_4_ | (uint)!bVar9 * auVar39._12_4_;
        bVar9 = (bool)((byte)(uVar34 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar9 * auVar40._16_4_ | (uint)!bVar9 * auVar39._16_4_;
        bVar9 = (bool)((byte)(uVar34 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar9 * auVar40._20_4_ | (uint)!bVar9 * auVar39._20_4_;
        bVar9 = (bool)((byte)(uVar34 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar9 * auVar40._24_4_ | (uint)!bVar9 * auVar39._24_4_;
        bVar9 = SUB81(uVar34 >> 7,0);
        auVar41._28_4_ = (uint)bVar9 * auVar40._28_4_ | (uint)!bVar9 * auVar39._28_4_;
        auVar39 = vpermt2q_avx512vl(auVar37,auVar41,auVar38);
        uVar33 = auVar39._0_8_;
        bVar23 = bVar23 - 1 & bVar23;
        if (bVar23 != 0) {
          auVar39 = vpshufd_avx2(auVar41,0x55);
          vpermt2q_avx512vl(auVar37,auVar39,auVar38);
          auVar40 = vpminsd_avx2(auVar41,auVar39);
          auVar39 = vpmaxsd_avx2(auVar41,auVar39);
          bVar23 = bVar23 - 1 & bVar23;
          if (bVar23 == 0) {
            auVar41 = vpermi2q_avx512vl(auVar40,auVar37,auVar38);
            uVar33 = auVar41._0_8_;
            auVar37 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
            *local_2880 = auVar37._0_8_;
            auVar36 = vpermd_avx2(auVar39,auVar36);
            *(int *)(local_2880 + 1) = auVar36._0_4_;
            local_2880 = local_2880 + 2;
          }
          else {
            auVar44 = vpshufd_avx2(auVar41,0xaa);
            vpermt2q_avx512vl(auVar37,auVar44,auVar38);
            auVar43 = vpminsd_avx2(auVar40,auVar44);
            auVar40 = vpmaxsd_avx2(auVar40,auVar44);
            auVar44 = vpminsd_avx2(auVar39,auVar40);
            auVar39 = vpmaxsd_avx2(auVar39,auVar40);
            bVar23 = bVar23 - 1 & bVar23;
            if (bVar23 == 0) {
              auVar41 = vpermi2q_avx512vl(auVar43,auVar37,auVar38);
              uVar33 = auVar41._0_8_;
              auVar41 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
              *local_2880 = auVar41._0_8_;
              auVar39 = vpermd_avx2(auVar39,auVar36);
              *(int *)(local_2880 + 1) = auVar39._0_4_;
              auVar37 = vpermt2q_avx512vl(auVar37,auVar44,auVar38);
              local_2880[2] = auVar37._0_8_;
              auVar36 = vpermd_avx2(auVar44,auVar36);
              *(int *)(local_2880 + 3) = auVar36._0_4_;
              local_2880 = local_2880 + 4;
            }
            else {
              auVar40 = vpshufd_avx2(auVar41,0xff);
              vpermt2q_avx512vl(auVar37,auVar40,auVar38);
              auVar45 = vpminsd_avx2(auVar43,auVar40);
              auVar40 = vpmaxsd_avx2(auVar43,auVar40);
              auVar43 = vpminsd_avx2(auVar44,auVar40);
              auVar40 = vpmaxsd_avx2(auVar44,auVar40);
              auVar44 = vpminsd_avx2(auVar39,auVar40);
              auVar39 = vpmaxsd_avx2(auVar39,auVar40);
              bVar23 = bVar23 - 1 & bVar23;
              if (bVar23 == 0) {
                auVar41 = vpermi2q_avx512vl(auVar45,auVar37,auVar38);
                uVar33 = auVar41._0_8_;
                auVar41 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                *local_2880 = auVar41._0_8_;
                auVar39 = vpermd_avx2(auVar39,auVar36);
                *(int *)(local_2880 + 1) = auVar39._0_4_;
                auVar39 = vpermt2q_avx512vl(auVar37,auVar44,auVar38);
                local_2880[2] = auVar39._0_8_;
                auVar39 = vpermd_avx2(auVar44,auVar36);
                *(int *)(local_2880 + 3) = auVar39._0_4_;
                auVar37 = vpermt2q_avx512vl(auVar37,auVar43,auVar38);
                local_2880[4] = auVar37._0_8_;
                auVar36 = vpermd_avx2(auVar43,auVar36);
                *(int *)(local_2880 + 5) = auVar36._0_4_;
                local_2880 = local_2880 + 6;
              }
              else {
                auVar42 = valignd_avx512vl(auVar41,auVar41,3);
                auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar40 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar41,auVar45);
                auVar41 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar40 = vpermt2d_avx512vl(auVar40,auVar41,auVar43);
                auVar40 = vpermt2d_avx512vl(auVar40,auVar41,auVar44);
                auVar41 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar39 = vpermt2d_avx512vl(auVar40,auVar41,auVar39);
                auVar99 = ZEXT3264(auVar39);
                bVar26 = bVar23;
                do {
                  auVar41 = auVar99._0_32_;
                  auVar43._8_4_ = 1;
                  auVar43._0_8_ = 0x100000001;
                  auVar43._12_4_ = 1;
                  auVar43._16_4_ = 1;
                  auVar43._20_4_ = 1;
                  auVar43._24_4_ = 1;
                  auVar43._28_4_ = 1;
                  auVar39 = vpermd_avx2(auVar43,auVar42);
                  auVar42 = valignd_avx512vl(auVar42,auVar42,1);
                  vpermt2q_avx512vl(auVar37,auVar42,auVar38);
                  bVar26 = bVar26 - 1 & bVar26;
                  uVar12 = vpcmpd_avx512vl(auVar39,auVar41,5);
                  auVar39 = vpmaxsd_avx2(auVar39,auVar41);
                  bVar13 = (byte)uVar12 << 1;
                  auVar41 = valignd_avx512vl(auVar41,auVar41,7);
                  bVar9 = (bool)((byte)uVar12 & 1);
                  auVar40._4_4_ = (uint)bVar9 * auVar41._4_4_ | (uint)!bVar9 * auVar39._4_4_;
                  auVar40._0_4_ = auVar39._0_4_;
                  bVar9 = (bool)(bVar13 >> 2 & 1);
                  auVar40._8_4_ = (uint)bVar9 * auVar41._8_4_ | (uint)!bVar9 * auVar39._8_4_;
                  bVar9 = (bool)(bVar13 >> 3 & 1);
                  auVar40._12_4_ = (uint)bVar9 * auVar41._12_4_ | (uint)!bVar9 * auVar39._12_4_;
                  bVar9 = (bool)(bVar13 >> 4 & 1);
                  auVar40._16_4_ = (uint)bVar9 * auVar41._16_4_ | (uint)!bVar9 * auVar39._16_4_;
                  bVar9 = (bool)(bVar13 >> 5 & 1);
                  auVar40._20_4_ = (uint)bVar9 * auVar41._20_4_ | (uint)!bVar9 * auVar39._20_4_;
                  bVar9 = (bool)(bVar13 >> 6 & 1);
                  auVar40._24_4_ = (uint)bVar9 * auVar41._24_4_ | (uint)!bVar9 * auVar39._24_4_;
                  auVar40._28_4_ =
                       (uint)(bVar13 >> 7) * auVar41._28_4_ |
                       (uint)!(bool)(bVar13 >> 7) * auVar39._28_4_;
                  auVar99 = ZEXT3264(auVar40);
                } while (bVar26 != 0);
                lVar24 = (ulong)(uint)POPCOUNT((uint)bVar23) + 3;
                do {
                  auVar39 = vpermi2q_avx512vl(auVar40,auVar37,auVar38);
                  *local_2880 = auVar39._0_8_;
                  auVar41 = auVar99._0_32_;
                  auVar39 = vpermd_avx2(auVar41,auVar36);
                  *(int *)(local_2880 + 1) = auVar39._0_4_;
                  auVar40 = valignd_avx512vl(auVar41,auVar41,1);
                  local_2880 = local_2880 + 2;
                  auVar99 = ZEXT3264(auVar40);
                  lVar24 = lVar24 + -1;
                } while (lVar24 != 0);
                auVar36 = vpermt2q_avx512vl(auVar37,auVar40,auVar38);
                uVar33 = auVar36._0_8_;
              }
              auVar99 = ZEXT3264(local_2740);
              auVar100 = ZEXT3264(local_2760);
              auVar101 = ZEXT3264(local_2780);
              auVar102 = ZEXT3264(local_27a0);
              auVar103 = ZEXT3264(local_27c0);
              auVar104 = ZEXT3264(local_27e0);
              auVar94 = ZEXT3264(auVar94._0_32_);
              auVar95 = ZEXT3264(auVar95._0_32_);
              auVar97 = ZEXT3264(auVar97._0_32_);
            }
          }
        }
      }
      local_2828 = (ulong)((uint)uVar33 & 0xf) - 8;
      if (local_2828 != 0) {
        uVar33 = uVar33 & 0xfffffffffffffff0;
        local_2818 = 0;
        do {
          lVar25 = local_2818 * 0xe0;
          lVar24 = uVar33 + 0xd0 + lVar25;
          local_26c0 = *(undefined8 *)(lVar24 + 0x10);
          uStack_26b8 = *(undefined8 *)(lVar24 + 0x18);
          lVar24 = uVar33 + 0xc0 + lVar25;
          local_2580 = *(undefined8 *)(lVar24 + 0x10);
          uStack_2578 = *(undefined8 *)(lVar24 + 0x18);
          uStack_2570 = local_2580;
          uStack_2568 = uStack_2578;
          uStack_26b0 = local_26c0;
          uStack_26a8 = uStack_26b8;
          auVar36._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x60 + lVar25);
          auVar36._0_16_ = *(undefined1 (*) [16])(uVar33 + lVar25);
          auVar47._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x70 + lVar25);
          auVar47._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x10 + lVar25);
          auVar48._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x80 + lVar25);
          auVar48._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x20 + lVar25);
          auVar4 = *(undefined1 (*) [16])(uVar33 + 0x30 + lVar25);
          auVar49._16_16_ = auVar4;
          auVar49._0_16_ = auVar4;
          auVar4 = *(undefined1 (*) [16])(uVar33 + 0x40 + lVar25);
          auVar50._16_16_ = auVar4;
          auVar50._0_16_ = auVar4;
          auVar4 = *(undefined1 (*) [16])(uVar33 + 0x50 + lVar25);
          auVar51._16_16_ = auVar4;
          auVar51._0_16_ = auVar4;
          auVar4 = *(undefined1 (*) [16])(uVar33 + 0x90 + lVar25);
          auVar52._16_16_ = auVar4;
          auVar52._0_16_ = auVar4;
          auVar4 = *(undefined1 (*) [16])(uVar33 + 0xa0 + lVar25);
          auVar53._16_16_ = auVar4;
          auVar53._0_16_ = auVar4;
          auVar4 = *(undefined1 (*) [16])(uVar33 + 0xb0 + lVar25);
          auVar57._16_16_ = auVar4;
          auVar57._0_16_ = auVar4;
          uVar70 = *(undefined4 *)(ray + k * 4);
          auVar98._4_4_ = uVar70;
          auVar98._0_4_ = uVar70;
          auVar98._8_4_ = uVar70;
          auVar98._12_4_ = uVar70;
          auVar98._16_4_ = uVar70;
          auVar98._20_4_ = uVar70;
          auVar98._24_4_ = uVar70;
          auVar98._28_4_ = uVar70;
          auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar70 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar66._4_4_ = uVar70;
          auVar66._0_4_ = uVar70;
          auVar66._8_4_ = uVar70;
          auVar66._12_4_ = uVar70;
          auVar66._16_4_ = uVar70;
          auVar66._20_4_ = uVar70;
          auVar66._24_4_ = uVar70;
          auVar66._28_4_ = uVar70;
          uVar70 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar68._4_4_ = uVar70;
          auVar68._0_4_ = uVar70;
          auVar68._8_4_ = uVar70;
          auVar68._12_4_ = uVar70;
          auVar68._16_4_ = uVar70;
          auVar68._20_4_ = uVar70;
          auVar68._24_4_ = uVar70;
          auVar68._28_4_ = uVar70;
          fVar71 = *(float *)(ray + k * 4 + 0x60);
          auVar80._4_4_ = fVar71;
          auVar80._0_4_ = fVar71;
          auVar80._8_4_ = fVar71;
          auVar80._12_4_ = fVar71;
          auVar80._16_4_ = fVar71;
          auVar80._20_4_ = fVar71;
          auVar80._24_4_ = fVar71;
          auVar80._28_4_ = fVar71;
          auVar36 = vsubps_avx(auVar36,auVar98);
          auVar41 = vsubps_avx512vl(auVar47,auVar38);
          auVar40 = vsubps_avx512vl(auVar48,auVar39);
          auVar43 = vsubps_avx512vl(auVar49,auVar98);
          auVar44 = vsubps_avx512vl(auVar50,auVar38);
          auVar45 = vsubps_avx512vl(auVar51,auVar39);
          auVar37 = vsubps_avx(auVar52,auVar98);
          auVar42 = vsubps_avx512vl(auVar53,auVar38);
          auVar46 = vsubps_avx512vl(auVar57,auVar39);
          auVar38 = vsubps_avx(auVar37,auVar36);
          auVar47 = vsubps_avx512vl(auVar42,auVar41);
          auVar39 = vsubps_avx(auVar46,auVar40);
          auVar48 = vsubps_avx512vl(auVar36,auVar43);
          auVar49 = vsubps_avx512vl(auVar41,auVar44);
          auVar50 = vsubps_avx512vl(auVar40,auVar45);
          auVar51 = vsubps_avx512vl(auVar43,auVar37);
          auVar52 = vsubps_avx512vl(auVar44,auVar42);
          auVar53 = vsubps_avx512vl(auVar45,auVar46);
          auVar64._0_4_ = auVar37._0_4_ + auVar36._0_4_;
          auVar64._4_4_ = auVar37._4_4_ + auVar36._4_4_;
          auVar64._8_4_ = auVar37._8_4_ + auVar36._8_4_;
          auVar64._12_4_ = auVar37._12_4_ + auVar36._12_4_;
          auVar64._16_4_ = auVar37._16_4_ + auVar36._16_4_;
          auVar64._20_4_ = auVar37._20_4_ + auVar36._20_4_;
          auVar64._24_4_ = auVar37._24_4_ + auVar36._24_4_;
          auVar64._28_4_ = auVar37._28_4_ + auVar36._28_4_;
          auVar54 = vaddps_avx512vl(auVar42,auVar41);
          auVar55 = vaddps_avx512vl(auVar46,auVar40);
          auVar56 = vmulps_avx512vl(auVar54,auVar39);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar47,auVar55);
          auVar55 = vmulps_avx512vl(auVar55,auVar38);
          auVar57 = vfmsub231ps_avx512vl(auVar55,auVar39,auVar64);
          auVar55._4_4_ = auVar47._4_4_ * auVar64._4_4_;
          auVar55._0_4_ = auVar47._0_4_ * auVar64._0_4_;
          auVar55._8_4_ = auVar47._8_4_ * auVar64._8_4_;
          auVar55._12_4_ = auVar47._12_4_ * auVar64._12_4_;
          auVar55._16_4_ = auVar47._16_4_ * auVar64._16_4_;
          auVar55._20_4_ = auVar47._20_4_ * auVar64._20_4_;
          auVar55._24_4_ = auVar47._24_4_ * auVar64._24_4_;
          auVar55._28_4_ = auVar64._28_4_;
          auVar4 = vfmsub231ps_fma(auVar55,auVar38,auVar54);
          auVar65._0_4_ = fVar71 * auVar4._0_4_;
          auVar65._4_4_ = fVar71 * auVar4._4_4_;
          auVar65._8_4_ = fVar71 * auVar4._8_4_;
          auVar65._12_4_ = fVar71 * auVar4._12_4_;
          auVar65._16_4_ = fVar71 * 0.0;
          auVar65._20_4_ = fVar71 * 0.0;
          auVar65._24_4_ = fVar71 * 0.0;
          auVar65._28_4_ = 0;
          auVar55 = vfmadd231ps_avx512vl(auVar65,auVar68,auVar57);
          local_2560 = vfmadd231ps_avx512vl(auVar55,auVar66,auVar56);
          auVar55 = vaddps_avx512vl(auVar36,auVar43);
          auVar54 = vaddps_avx512vl(auVar41,auVar44);
          auVar56 = vaddps_avx512vl(auVar40,auVar45);
          auVar57 = vmulps_avx512vl(auVar54,auVar50);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar49,auVar56);
          auVar56 = vmulps_avx512vl(auVar56,auVar48);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar50,auVar55);
          auVar55 = vmulps_avx512vl(auVar55,auVar49);
          auVar55 = vfmsub231ps_avx512vl(auVar55,auVar48,auVar54);
          auVar54._4_4_ = fVar71 * auVar55._4_4_;
          auVar54._0_4_ = fVar71 * auVar55._0_4_;
          auVar54._8_4_ = fVar71 * auVar55._8_4_;
          auVar54._12_4_ = fVar71 * auVar55._12_4_;
          auVar54._16_4_ = fVar71 * auVar55._16_4_;
          auVar54._20_4_ = fVar71 * auVar55._20_4_;
          auVar54._24_4_ = fVar71 * auVar55._24_4_;
          auVar54._28_4_ = auVar55._28_4_;
          auVar55 = vfmadd231ps_avx512vl(auVar54,auVar68,auVar56);
          local_2540 = vfmadd231ps_avx512vl(auVar55,auVar66,auVar57);
          auVar37 = vaddps_avx512vl(auVar43,auVar37);
          auVar43 = vaddps_avx512vl(auVar44,auVar42);
          auVar44 = vaddps_avx512vl(auVar45,auVar46);
          auVar45 = vmulps_avx512vl(auVar43,auVar53);
          auVar45 = vfmsub231ps_avx512vl(auVar45,auVar52,auVar44);
          auVar46._4_4_ = auVar44._4_4_ * auVar51._4_4_;
          auVar46._0_4_ = auVar44._0_4_ * auVar51._0_4_;
          auVar46._8_4_ = auVar44._8_4_ * auVar51._8_4_;
          auVar46._12_4_ = auVar44._12_4_ * auVar51._12_4_;
          auVar46._16_4_ = auVar44._16_4_ * auVar51._16_4_;
          auVar46._20_4_ = auVar44._20_4_ * auVar51._20_4_;
          auVar46._24_4_ = auVar44._24_4_ * auVar51._24_4_;
          auVar46._28_4_ = auVar44._28_4_;
          auVar4 = vfmsub231ps_fma(auVar46,auVar53,auVar37);
          auVar56._4_4_ = auVar37._4_4_ * auVar52._4_4_;
          auVar56._0_4_ = auVar37._0_4_ * auVar52._0_4_;
          auVar56._8_4_ = auVar37._8_4_ * auVar52._8_4_;
          auVar56._12_4_ = auVar37._12_4_ * auVar52._12_4_;
          auVar56._16_4_ = auVar37._16_4_ * auVar52._16_4_;
          auVar56._20_4_ = auVar37._20_4_ * auVar52._20_4_;
          auVar56._24_4_ = auVar37._24_4_ * auVar52._24_4_;
          auVar56._28_4_ = auVar37._28_4_;
          auVar37 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar43);
          auVar37 = vmulps_avx512vl(auVar37,auVar80);
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar68,ZEXT1632(auVar4));
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar66,auVar45);
          auVar96._0_4_ = local_2560._0_4_ + local_2540._0_4_;
          auVar96._4_4_ = local_2560._4_4_ + local_2540._4_4_;
          auVar96._8_4_ = local_2560._8_4_ + local_2540._8_4_;
          auVar96._12_4_ = local_2560._12_4_ + local_2540._12_4_;
          auVar96._16_4_ = local_2560._16_4_ + local_2540._16_4_;
          auVar96._20_4_ = local_2560._20_4_ + local_2540._20_4_;
          auVar96._24_4_ = local_2560._24_4_ + local_2540._24_4_;
          auVar96._28_4_ = local_2560._28_4_ + local_2540._28_4_;
          local_2520 = vaddps_avx512vl(auVar37,auVar96);
          auVar44._8_4_ = 0x7fffffff;
          auVar44._0_8_ = 0x7fffffff7fffffff;
          auVar44._12_4_ = 0x7fffffff;
          auVar44._16_4_ = 0x7fffffff;
          auVar44._20_4_ = 0x7fffffff;
          auVar44._24_4_ = 0x7fffffff;
          auVar44._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_2520,auVar44);
          auVar45._8_4_ = 0x34000000;
          auVar45._0_8_ = 0x3400000034000000;
          auVar45._12_4_ = 0x34000000;
          auVar45._16_4_ = 0x34000000;
          auVar45._20_4_ = 0x34000000;
          auVar45._24_4_ = 0x34000000;
          auVar45._28_4_ = 0x34000000;
          auVar43 = vmulps_avx512vl(local_2520,auVar45);
          auVar44 = vminps_avx512vl(local_2560,local_2540);
          auVar44 = vminps_avx512vl(auVar44,auVar37);
          auVar42._8_4_ = 0x80000000;
          auVar42._0_8_ = 0x8000000080000000;
          auVar42._12_4_ = 0x80000000;
          auVar42._16_4_ = 0x80000000;
          auVar42._20_4_ = 0x80000000;
          auVar42._24_4_ = 0x80000000;
          auVar42._28_4_ = 0x80000000;
          auVar45 = vxorps_avx512vl(auVar43,auVar42);
          uVar12 = vcmpps_avx512vl(auVar44,auVar45,5);
          auVar44 = vmaxps_avx512vl(local_2560,local_2540);
          auVar37 = vmaxps_avx512vl(auVar44,auVar37);
          uVar10 = vcmpps_avx512vl(auVar37,auVar43,2);
          bVar23 = (byte)uVar12 | (byte)uVar10;
          if (bVar23 != 0) {
            auVar37 = vmulps_avx512vl(auVar49,auVar39);
            auVar43 = vmulps_avx512vl(auVar38,auVar50);
            auVar44 = vmulps_avx512vl(auVar48,auVar47);
            auVar45 = vmulps_avx512vl(auVar52,auVar50);
            auVar42 = vmulps_avx512vl(auVar48,auVar53);
            auVar55 = vmulps_avx512vl(auVar51,auVar49);
            auVar54 = vfmsub213ps_avx512vl(auVar47,auVar50,auVar37);
            auVar39 = vfmsub213ps_avx512vl(auVar39,auVar48,auVar43);
            auVar38 = vfmsub213ps_avx512vl(auVar38,auVar49,auVar44);
            auVar46 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar45);
            auVar56 = vfmsub213ps_avx512vl(auVar51,auVar50,auVar42);
            auVar47 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar55);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar37,auVar48);
            vandps_avx512vl(auVar45,auVar48);
            uVar34 = vcmpps_avx512vl(auVar48,auVar48,1);
            vandps_avx512vl(auVar43,auVar48);
            vandps_avx512vl(auVar42,auVar48);
            uVar35 = vcmpps_avx512vl(auVar48,auVar48,1);
            vandps_avx512vl(auVar44,auVar48);
            vandps_avx512vl(auVar55,auVar48);
            uVar11 = vcmpps_avx512vl(auVar48,auVar48,1);
            bVar9 = (bool)((byte)uVar34 & 1);
            local_2500._0_4_ = (float)((uint)bVar9 * auVar54._0_4_ | (uint)!bVar9 * auVar46._0_4_);
            bVar9 = (bool)((byte)(uVar34 >> 1) & 1);
            local_2500._4_4_ = (float)((uint)bVar9 * auVar54._4_4_ | (uint)!bVar9 * auVar46._4_4_);
            bVar9 = (bool)((byte)(uVar34 >> 2) & 1);
            local_2500._8_4_ = (float)((uint)bVar9 * auVar54._8_4_ | (uint)!bVar9 * auVar46._8_4_);
            bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
            local_2500._12_4_ =
                 (float)((uint)bVar9 * auVar54._12_4_ | (uint)!bVar9 * auVar46._12_4_);
            bVar9 = (bool)((byte)(uVar34 >> 4) & 1);
            local_2500._16_4_ =
                 (float)((uint)bVar9 * auVar54._16_4_ | (uint)!bVar9 * auVar46._16_4_);
            bVar9 = (bool)((byte)(uVar34 >> 5) & 1);
            local_2500._20_4_ =
                 (float)((uint)bVar9 * auVar54._20_4_ | (uint)!bVar9 * auVar46._20_4_);
            bVar9 = (bool)((byte)(uVar34 >> 6) & 1);
            local_2500._24_4_ =
                 (float)((uint)bVar9 * auVar54._24_4_ | (uint)!bVar9 * auVar46._24_4_);
            bVar9 = SUB81(uVar34 >> 7,0);
            local_2500._28_4_ = (uint)bVar9 * auVar54._28_4_ | (uint)!bVar9 * auVar46._28_4_;
            bVar9 = (bool)((byte)uVar35 & 1);
            local_24e0._0_4_ = (float)((uint)bVar9 * auVar39._0_4_ | (uint)!bVar9 * auVar56._0_4_);
            bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
            local_24e0._4_4_ = (float)((uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * auVar56._4_4_);
            bVar9 = (bool)((byte)(uVar35 >> 2) & 1);
            local_24e0._8_4_ = (float)((uint)bVar9 * auVar39._8_4_ | (uint)!bVar9 * auVar56._8_4_);
            bVar9 = (bool)((byte)(uVar35 >> 3) & 1);
            local_24e0._12_4_ =
                 (float)((uint)bVar9 * auVar39._12_4_ | (uint)!bVar9 * auVar56._12_4_);
            bVar9 = (bool)((byte)(uVar35 >> 4) & 1);
            local_24e0._16_4_ =
                 (float)((uint)bVar9 * auVar39._16_4_ | (uint)!bVar9 * auVar56._16_4_);
            bVar9 = (bool)((byte)(uVar35 >> 5) & 1);
            local_24e0._20_4_ =
                 (float)((uint)bVar9 * auVar39._20_4_ | (uint)!bVar9 * auVar56._20_4_);
            bVar9 = (bool)((byte)(uVar35 >> 6) & 1);
            local_24e0._24_4_ =
                 (float)((uint)bVar9 * auVar39._24_4_ | (uint)!bVar9 * auVar56._24_4_);
            bVar9 = SUB81(uVar35 >> 7,0);
            local_24e0._28_4_ = (uint)bVar9 * auVar39._28_4_ | (uint)!bVar9 * auVar56._28_4_;
            bVar9 = (bool)((byte)uVar11 & 1);
            local_24c0 = (float)((uint)bVar9 * auVar38._0_4_ | (uint)!bVar9 * auVar47._0_4_);
            bVar9 = (bool)((byte)(uVar11 >> 1) & 1);
            fStack_24bc = (float)((uint)bVar9 * auVar38._4_4_ | (uint)!bVar9 * auVar47._4_4_);
            bVar9 = (bool)((byte)(uVar11 >> 2) & 1);
            fStack_24b8 = (float)((uint)bVar9 * auVar38._8_4_ | (uint)!bVar9 * auVar47._8_4_);
            bVar9 = (bool)((byte)(uVar11 >> 3) & 1);
            fStack_24b4 = (float)((uint)bVar9 * auVar38._12_4_ | (uint)!bVar9 * auVar47._12_4_);
            bVar9 = (bool)((byte)(uVar11 >> 4) & 1);
            fStack_24b0 = (float)((uint)bVar9 * auVar38._16_4_ | (uint)!bVar9 * auVar47._16_4_);
            bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
            fStack_24ac = (float)((uint)bVar9 * auVar38._20_4_ | (uint)!bVar9 * auVar47._20_4_);
            bVar9 = (bool)((byte)(uVar11 >> 6) & 1);
            fStack_24a8 = (float)((uint)bVar9 * auVar38._24_4_ | (uint)!bVar9 * auVar47._24_4_);
            bVar9 = SUB81(uVar11 >> 7,0);
            uStack_24a4 = (uint)bVar9 * auVar38._28_4_ | (uint)!bVar9 * auVar47._28_4_;
            auVar18._4_4_ = fVar71 * fStack_24bc;
            auVar18._0_4_ = fVar71 * local_24c0;
            auVar18._8_4_ = fVar71 * fStack_24b8;
            auVar18._12_4_ = fVar71 * fStack_24b4;
            auVar18._16_4_ = fVar71 * fStack_24b0;
            auVar18._20_4_ = fVar71 * fStack_24ac;
            auVar18._24_4_ = fVar71 * fStack_24a8;
            auVar18._28_4_ = fVar71;
            auVar4 = vfmadd213ps_fma(auVar68,local_24e0,auVar18);
            auVar4 = vfmadd213ps_fma(auVar66,local_2500,ZEXT1632(auVar4));
            auVar38 = ZEXT1632(CONCAT412(auVar4._12_4_ + auVar4._12_4_,
                                         CONCAT48(auVar4._8_4_ + auVar4._8_4_,
                                                  CONCAT44(auVar4._4_4_ + auVar4._4_4_,
                                                           auVar4._0_4_ + auVar4._0_4_))));
            auVar69._0_4_ = auVar40._0_4_ * local_24c0;
            auVar69._4_4_ = auVar40._4_4_ * fStack_24bc;
            auVar69._8_4_ = auVar40._8_4_ * fStack_24b8;
            auVar69._12_4_ = auVar40._12_4_ * fStack_24b4;
            auVar69._16_4_ = auVar40._16_4_ * fStack_24b0;
            auVar69._20_4_ = auVar40._20_4_ * fStack_24ac;
            auVar69._24_4_ = auVar40._24_4_ * fStack_24a8;
            auVar69._28_4_ = 0;
            auVar4 = vfmadd213ps_fma(auVar41,local_24e0,auVar69);
            auVar14 = vfmadd213ps_fma(auVar36,local_2500,ZEXT1632(auVar4));
            auVar36 = vrcp14ps_avx512vl(auVar38);
            auVar15._8_4_ = 0x3f800000;
            auVar15._0_8_ = 0x3f8000003f800000;
            auVar15._12_4_ = 0x3f800000;
            auVar15._16_4_ = 0x3f800000;
            auVar15._20_4_ = 0x3f800000;
            auVar15._24_4_ = 0x3f800000;
            auVar15._28_4_ = 0x3f800000;
            auVar37 = vfnmadd213ps_avx512vl(auVar36,auVar38,auVar15);
            auVar4 = vfmadd132ps_fma(auVar37,auVar36,auVar36);
            uVar70 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar72._4_4_ = uVar70;
            auVar72._0_4_ = uVar70;
            auVar72._8_4_ = uVar70;
            auVar72._12_4_ = uVar70;
            auVar72._16_4_ = uVar70;
            auVar72._20_4_ = uVar70;
            auVar72._24_4_ = uVar70;
            auVar72._28_4_ = uVar70;
            auVar94 = ZEXT3264(auVar72);
            local_2440 = ZEXT1632(CONCAT412(auVar4._12_4_ * (auVar14._12_4_ + auVar14._12_4_),
                                            CONCAT48(auVar4._8_4_ * (auVar14._8_4_ + auVar14._8_4_),
                                                     CONCAT44(auVar4._4_4_ *
                                                              (auVar14._4_4_ + auVar14._4_4_),
                                                              auVar4._0_4_ *
                                                              (auVar14._0_4_ + auVar14._0_4_)))));
            auVar63 = ZEXT3264(local_2440);
            uVar12 = vcmpps_avx512vl(local_2440,auVar72,2);
            uVar70 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar16._4_4_ = uVar70;
            auVar16._0_4_ = uVar70;
            auVar16._8_4_ = uVar70;
            auVar16._12_4_ = uVar70;
            auVar16._16_4_ = uVar70;
            auVar16._20_4_ = uVar70;
            auVar16._24_4_ = uVar70;
            auVar16._28_4_ = uVar70;
            uVar10 = vcmpps_avx512vl(local_2440,auVar16,0xd);
            bVar23 = (byte)uVar12 & (byte)uVar10 & bVar23;
            if (bVar23 != 0) {
              uVar34 = vcmpps_avx512vl(auVar38,_DAT_01faff00,4);
              uVar34 = bVar23 & uVar34;
              local_24a0 = (byte)uVar34;
              if (local_24a0 != 0) {
                local_23c0 = 0xf0;
                local_2820 = context->scene;
                auVar17._8_4_ = 0x219392ef;
                auVar17._0_8_ = 0x219392ef219392ef;
                auVar17._12_4_ = 0x219392ef;
                auVar17._16_4_ = 0x219392ef;
                auVar17._20_4_ = 0x219392ef;
                auVar17._24_4_ = 0x219392ef;
                auVar17._28_4_ = 0x219392ef;
                uVar35 = vcmpps_avx512vl(local_2520,auVar17,5);
                auVar37 = vrcp14ps_avx512vl(local_2520);
                auVar67._8_4_ = 0x3f800000;
                auVar67._0_8_ = 0x3f8000003f800000;
                auVar67._12_4_ = 0x3f800000;
                auVar67._16_4_ = 0x3f800000;
                auVar67._20_4_ = 0x3f800000;
                auVar67._24_4_ = 0x3f800000;
                auVar67._28_4_ = 0x3f800000;
                auVar4 = vfnmadd213ps_fma(local_2520,auVar37,auVar67);
                auVar36 = vfmadd132ps_avx512vl(ZEXT1632(auVar4),auVar37,auVar37);
                fVar79 = (float)((uint)((byte)uVar35 & 1) * auVar36._0_4_);
                fVar71 = (float)((uint)((byte)(uVar35 >> 1) & 1) * auVar36._4_4_);
                fVar76 = (float)((uint)((byte)(uVar35 >> 2) & 1) * auVar36._8_4_);
                fVar75 = (float)((uint)((byte)(uVar35 >> 3) & 1) * auVar36._12_4_);
                fVar74 = (float)((uint)((byte)(uVar35 >> 4) & 1) * auVar36._16_4_);
                fVar73 = (float)((uint)((byte)(uVar35 >> 5) & 1) * auVar36._20_4_);
                fVar87 = (float)((uint)((byte)(uVar35 >> 6) & 1) * auVar36._24_4_);
                auVar19._4_4_ = fVar71 * local_2560._4_4_;
                auVar19._0_4_ = fVar79 * local_2560._0_4_;
                auVar19._8_4_ = fVar76 * local_2560._8_4_;
                auVar19._12_4_ = fVar75 * local_2560._12_4_;
                auVar19._16_4_ = fVar74 * local_2560._16_4_;
                auVar19._20_4_ = fVar73 * local_2560._20_4_;
                auVar19._24_4_ = fVar87 * local_2560._24_4_;
                auVar19._28_4_ = local_2560._28_4_;
                auVar36 = vminps_avx(auVar19,auVar67);
                auVar20._4_4_ = fVar71 * local_2540._4_4_;
                auVar20._0_4_ = fVar79 * local_2540._0_4_;
                auVar20._8_4_ = fVar76 * local_2540._8_4_;
                auVar20._12_4_ = fVar75 * local_2540._12_4_;
                auVar20._16_4_ = fVar74 * local_2540._16_4_;
                auVar20._20_4_ = fVar73 * local_2540._20_4_;
                auVar20._24_4_ = fVar87 * local_2540._24_4_;
                auVar20._28_4_ = auVar37._28_4_;
                auVar37 = vminps_avx(auVar20,auVar67);
                auVar38 = vsubps_avx(auVar67,auVar36);
                auVar39 = vsubps_avx(auVar67,auVar37);
                local_2460 = vblendps_avx(auVar37,auVar38,0xf0);
                local_2480 = vblendps_avx(auVar36,auVar39,0xf0);
                fVar71 = (float)DAT_01fef940;
                fVar79 = DAT_01fef940._4_4_;
                fVar87 = DAT_01fef940._8_4_;
                fVar73 = DAT_01fef940._12_4_;
                fVar74 = DAT_01fef940._16_4_;
                fVar75 = DAT_01fef940._20_4_;
                fVar76 = DAT_01fef940._24_4_;
                local_2420[0] = local_2500._0_4_ * fVar71;
                local_2420[1] = local_2500._4_4_ * fVar79;
                local_2420[2] = local_2500._8_4_ * fVar87;
                local_2420[3] = local_2500._12_4_ * fVar73;
                fStack_2410 = local_2500._16_4_ * fVar74;
                fStack_240c = local_2500._20_4_ * fVar75;
                fStack_2408 = local_2500._24_4_ * fVar76;
                uStack_2404 = local_2500._28_4_;
                local_2400[0] = local_24e0._0_4_ * fVar71;
                local_2400[1] = local_24e0._4_4_ * fVar79;
                local_2400[2] = local_24e0._8_4_ * fVar87;
                local_2400[3] = local_24e0._12_4_ * fVar73;
                fStack_23f0 = local_24e0._16_4_ * fVar74;
                fStack_23ec = local_24e0._20_4_ * fVar75;
                fStack_23e8 = local_24e0._24_4_ * fVar76;
                uStack_23e4 = local_24e0._28_4_;
                local_23e0[0] = local_24c0 * fVar71;
                local_23e0[1] = fStack_24bc * fVar79;
                local_23e0[2] = fStack_24b8 * fVar87;
                local_23e0[3] = fStack_24b4 * fVar73;
                fStack_23d0 = fStack_24b0 * fVar74;
                fStack_23cc = fStack_24ac * fVar75;
                fStack_23c8 = fStack_24a8 * fVar76;
                uStack_23c4 = uStack_24a4;
                auVar60._8_4_ = 0x7f800000;
                auVar60._0_8_ = 0x7f8000007f800000;
                auVar60._12_4_ = 0x7f800000;
                auVar60._16_4_ = 0x7f800000;
                auVar60._20_4_ = 0x7f800000;
                auVar60._24_4_ = 0x7f800000;
                auVar60._28_4_ = 0x7f800000;
                auVar36 = vblendmps_avx512vl(auVar60,local_2440);
                auVar58._0_4_ =
                     (uint)(local_24a0 & 1) * auVar36._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
                bVar9 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar58._4_4_ = (uint)bVar9 * auVar36._4_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar58._8_4_ = (uint)bVar9 * auVar36._8_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
                auVar58._12_4_ = (uint)bVar9 * auVar36._12_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar34 >> 4) & 1);
                auVar58._16_4_ = (uint)bVar9 * auVar36._16_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar34 >> 5) & 1);
                auVar58._20_4_ = (uint)bVar9 * auVar36._20_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar34 >> 6) & 1);
                auVar58._24_4_ = (uint)bVar9 * auVar36._24_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = SUB81(uVar34 >> 7,0);
                auVar58._28_4_ = (uint)bVar9 * auVar36._28_4_ | (uint)!bVar9 * 0x7f800000;
                auVar36 = vshufps_avx(auVar58,auVar58,0xb1);
                auVar36 = vminps_avx(auVar58,auVar36);
                auVar37 = vshufpd_avx(auVar36,auVar36,5);
                auVar36 = vminps_avx(auVar36,auVar37);
                auVar37 = vpermpd_avx2(auVar36,0x4e);
                auVar36 = vminps_avx(auVar36,auVar37);
                uVar12 = vcmpps_avx512vl(auVar58,auVar36,0);
                uVar28 = (uint)uVar34;
                if (((byte)uVar12 & local_24a0) != 0) {
                  uVar28 = (uint)((byte)uVar12 & local_24a0);
                }
                uVar27 = 0;
                for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                  uVar27 = uVar27 + 1;
                }
                do {
                  uVar30 = uVar27 & 0xff;
                  uVar28 = *(uint *)((long)&local_2580 + (ulong)uVar30 * 4);
                  pGVar5 = (local_2820->geometries).items[uVar28].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar34 = (ulong)(byte)(~(byte)(1 << (uVar27 & 0x1f)) & (byte)uVar34);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar34 = (ulong)(uVar30 << 2);
                      uVar70 = *(undefined4 *)(local_2480 + uVar34);
                      uVar3 = *(undefined4 *)(local_2460 + uVar34);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar34);
                      *(undefined4 *)(ray + k * 4 + 0xc0) =
                           *(undefined4 *)((long)local_2420 + uVar34);
                      *(undefined4 *)(ray + k * 4 + 0xd0) =
                           *(undefined4 *)((long)local_2400 + uVar34);
                      *(undefined4 *)(ray + k * 4 + 0xe0) =
                           *(undefined4 *)((long)local_23e0 + uVar34);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar70;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)((long)&local_26c0 + uVar34);
                      *(uint *)(ray + k * 4 + 0x120) = uVar28;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar35 = (ulong)(uVar30 * 4);
                    uVar70 = *(undefined4 *)(local_2480 + uVar35);
                    local_2660._4_4_ = uVar70;
                    local_2660._0_4_ = uVar70;
                    local_2660._8_4_ = uVar70;
                    local_2660._12_4_ = uVar70;
                    local_2650 = *(undefined4 *)(local_2460 + uVar35);
                    local_2630 = vpbroadcastd_avx512vl();
                    uVar70 = *(undefined4 *)((long)&local_26c0 + uVar35);
                    local_2640._4_4_ = uVar70;
                    local_2640._0_4_ = uVar70;
                    local_2640._8_4_ = uVar70;
                    local_2640._12_4_ = uVar70;
                    uVar70 = *(undefined4 *)((long)local_2420 + uVar35);
                    uVar3 = *(undefined4 *)((long)local_2400 + uVar35);
                    local_2680._4_4_ = uVar3;
                    local_2680._0_4_ = uVar3;
                    local_2680._8_4_ = uVar3;
                    local_2680._12_4_ = uVar3;
                    uVar3 = *(undefined4 *)((long)local_23e0 + uVar35);
                    local_2670._4_4_ = uVar3;
                    local_2670._0_4_ = uVar3;
                    local_2670._8_4_ = uVar3;
                    local_2670._12_4_ = uVar3;
                    local_2690[0] = (RTCHitN)(char)uVar70;
                    local_2690[1] = (RTCHitN)(char)((uint)uVar70 >> 8);
                    local_2690[2] = (RTCHitN)(char)((uint)uVar70 >> 0x10);
                    local_2690[3] = (RTCHitN)(char)((uint)uVar70 >> 0x18);
                    local_2690[4] = (RTCHitN)(char)uVar70;
                    local_2690[5] = (RTCHitN)(char)((uint)uVar70 >> 8);
                    local_2690[6] = (RTCHitN)(char)((uint)uVar70 >> 0x10);
                    local_2690[7] = (RTCHitN)(char)((uint)uVar70 >> 0x18);
                    local_2690[8] = (RTCHitN)(char)uVar70;
                    local_2690[9] = (RTCHitN)(char)((uint)uVar70 >> 8);
                    local_2690[10] = (RTCHitN)(char)((uint)uVar70 >> 0x10);
                    local_2690[0xb] = (RTCHitN)(char)((uint)uVar70 >> 0x18);
                    local_2690[0xc] = (RTCHitN)(char)uVar70;
                    local_2690[0xd] = (RTCHitN)(char)((uint)uVar70 >> 8);
                    local_2690[0xe] = (RTCHitN)(char)((uint)uVar70 >> 0x10);
                    local_2690[0xf] = (RTCHitN)(char)((uint)uVar70 >> 0x18);
                    uStack_264c = local_2650;
                    uStack_2648 = local_2650;
                    uStack_2644 = local_2650;
                    vpcmpeqd_avx2(ZEXT1632(local_2660),ZEXT1632(local_2660));
                    uStack_261c = context->user->instID[0];
                    local_2620 = uStack_261c;
                    uStack_2618 = uStack_261c;
                    uStack_2614 = uStack_261c;
                    uStack_2610 = context->user->instPrimID[0];
                    uStack_260c = uStack_2610;
                    uStack_2608 = uStack_2610;
                    uStack_2604 = uStack_2610;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar35);
                    local_2840 = local_2710;
                    local_2810.valid = (int *)local_2840;
                    local_2810.geometryUserPtr = pGVar5->userPtr;
                    local_2810.context = context->user;
                    local_2810.hit = local_2690;
                    local_2810.N = 4;
                    local_26e0 = auVar63._0_32_;
                    local_2700 = auVar94._0_32_;
                    local_2810.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar5->intersectionFilterN)(&local_2810);
                      auVar94 = ZEXT3264(local_2700);
                      auVar63 = ZEXT3264(local_26e0);
                      auVar104 = ZEXT3264(local_27e0);
                      auVar103 = ZEXT3264(local_27c0);
                      auVar102 = ZEXT3264(local_27a0);
                      auVar101 = ZEXT3264(local_2780);
                      auVar100 = ZEXT3264(local_2760);
                      auVar99 = ZEXT3264(local_2740);
                    }
                    uVar35 = vptestmd_avx512vl(local_2840,local_2840);
                    if ((uVar35 & 0xf) == 0) {
LAB_007a0b28:
                      *(int *)(ray + k * 4 + 0x80) = auVar94._0_4_;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&local_2810);
                        auVar94 = ZEXT3264(local_2700);
                        auVar63 = ZEXT3264(local_26e0);
                        auVar104 = ZEXT3264(local_27e0);
                        auVar103 = ZEXT3264(local_27c0);
                        auVar102 = ZEXT3264(local_27a0);
                        auVar101 = ZEXT3264(local_2780);
                        auVar100 = ZEXT3264(local_2760);
                        auVar99 = ZEXT3264(local_2740);
                      }
                      uVar35 = vptestmd_avx512vl(local_2840,local_2840);
                      uVar35 = uVar35 & 0xf;
                      bVar23 = (byte)uVar35;
                      if (bVar23 == 0) goto LAB_007a0b28;
                      iVar2 = *(int *)(local_2810.hit + 4);
                      iVar21 = *(int *)(local_2810.hit + 8);
                      iVar22 = *(int *)(local_2810.hit + 0xc);
                      bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar8 = SUB81(uVar35 >> 3,0);
                      *(uint *)(local_2810.ray + 0xc0) =
                           (uint)(bVar23 & 1) * *(int *)local_2810.hit |
                           (uint)!(bool)(bVar23 & 1) * *(int *)(local_2810.ray + 0xc0);
                      *(uint *)(local_2810.ray + 0xc4) =
                           (uint)bVar9 * iVar2 | (uint)!bVar9 * *(int *)(local_2810.ray + 0xc4);
                      *(uint *)(local_2810.ray + 200) =
                           (uint)bVar7 * iVar21 | (uint)!bVar7 * *(int *)(local_2810.ray + 200);
                      *(uint *)(local_2810.ray + 0xcc) =
                           (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(local_2810.ray + 0xcc);
                      iVar2 = *(int *)(local_2810.hit + 0x14);
                      iVar21 = *(int *)(local_2810.hit + 0x18);
                      iVar22 = *(int *)(local_2810.hit + 0x1c);
                      bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar8 = SUB81(uVar35 >> 3,0);
                      *(uint *)(local_2810.ray + 0xd0) =
                           (uint)(bVar23 & 1) * *(int *)(local_2810.hit + 0x10) |
                           (uint)!(bool)(bVar23 & 1) * *(int *)(local_2810.ray + 0xd0);
                      *(uint *)(local_2810.ray + 0xd4) =
                           (uint)bVar9 * iVar2 | (uint)!bVar9 * *(int *)(local_2810.ray + 0xd4);
                      *(uint *)(local_2810.ray + 0xd8) =
                           (uint)bVar7 * iVar21 | (uint)!bVar7 * *(int *)(local_2810.ray + 0xd8);
                      *(uint *)(local_2810.ray + 0xdc) =
                           (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(local_2810.ray + 0xdc);
                      iVar2 = *(int *)(local_2810.hit + 0x24);
                      iVar21 = *(int *)(local_2810.hit + 0x28);
                      iVar22 = *(int *)(local_2810.hit + 0x2c);
                      bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar8 = SUB81(uVar35 >> 3,0);
                      *(uint *)(local_2810.ray + 0xe0) =
                           (uint)(bVar23 & 1) * *(int *)(local_2810.hit + 0x20) |
                           (uint)!(bool)(bVar23 & 1) * *(int *)(local_2810.ray + 0xe0);
                      *(uint *)(local_2810.ray + 0xe4) =
                           (uint)bVar9 * iVar2 | (uint)!bVar9 * *(int *)(local_2810.ray + 0xe4);
                      *(uint *)(local_2810.ray + 0xe8) =
                           (uint)bVar7 * iVar21 | (uint)!bVar7 * *(int *)(local_2810.ray + 0xe8);
                      *(uint *)(local_2810.ray + 0xec) =
                           (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(local_2810.ray + 0xec);
                      iVar2 = *(int *)(local_2810.hit + 0x34);
                      iVar21 = *(int *)(local_2810.hit + 0x38);
                      iVar22 = *(int *)(local_2810.hit + 0x3c);
                      bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar8 = SUB81(uVar35 >> 3,0);
                      *(uint *)(local_2810.ray + 0xf0) =
                           (uint)(bVar23 & 1) * *(int *)(local_2810.hit + 0x30) |
                           (uint)!(bool)(bVar23 & 1) * *(int *)(local_2810.ray + 0xf0);
                      *(uint *)(local_2810.ray + 0xf4) =
                           (uint)bVar9 * iVar2 | (uint)!bVar9 * *(int *)(local_2810.ray + 0xf4);
                      *(uint *)(local_2810.ray + 0xf8) =
                           (uint)bVar7 * iVar21 | (uint)!bVar7 * *(int *)(local_2810.ray + 0xf8);
                      *(uint *)(local_2810.ray + 0xfc) =
                           (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(local_2810.ray + 0xfc);
                      iVar2 = *(int *)(local_2810.hit + 0x44);
                      iVar21 = *(int *)(local_2810.hit + 0x48);
                      iVar22 = *(int *)(local_2810.hit + 0x4c);
                      bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar8 = SUB81(uVar35 >> 3,0);
                      *(uint *)(local_2810.ray + 0x100) =
                           (uint)(bVar23 & 1) * *(int *)(local_2810.hit + 0x40) |
                           (uint)!(bool)(bVar23 & 1) * *(int *)(local_2810.ray + 0x100);
                      *(uint *)(local_2810.ray + 0x104) =
                           (uint)bVar9 * iVar2 | (uint)!bVar9 * *(int *)(local_2810.ray + 0x104);
                      *(uint *)(local_2810.ray + 0x108) =
                           (uint)bVar7 * iVar21 | (uint)!bVar7 * *(int *)(local_2810.ray + 0x108);
                      *(uint *)(local_2810.ray + 0x10c) =
                           (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(local_2810.ray + 0x10c);
                      auVar4 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x50));
                      *(undefined1 (*) [16])(local_2810.ray + 0x110) = auVar4;
                      auVar4 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x60));
                      *(undefined1 (*) [16])(local_2810.ray + 0x120) = auVar4;
                      auVar4 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x70));
                      *(undefined1 (*) [16])(local_2810.ray + 0x130) = auVar4;
                      auVar4 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x80));
                      *(undefined1 (*) [16])(local_2810.ray + 0x140) = auVar4;
                      auVar94 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    uVar70 = auVar94._0_4_;
                    auVar62._4_4_ = uVar70;
                    auVar62._0_4_ = uVar70;
                    auVar62._8_4_ = uVar70;
                    auVar62._12_4_ = uVar70;
                    auVar62._16_4_ = uVar70;
                    auVar62._20_4_ = uVar70;
                    auVar62._24_4_ = uVar70;
                    auVar62._28_4_ = uVar70;
                    uVar35 = vcmpps_avx512vl(auVar63._0_32_,auVar62,2);
                    uVar34 = (byte)(~(byte)(1 << (uVar27 & 0x1f)) & (byte)uVar34) & uVar35;
                  }
                  bVar23 = (byte)uVar34;
                  if (bVar23 == 0) break;
                  auVar61._8_4_ = 0x7f800000;
                  auVar61._0_8_ = 0x7f8000007f800000;
                  auVar61._12_4_ = 0x7f800000;
                  auVar61._16_4_ = 0x7f800000;
                  auVar61._20_4_ = 0x7f800000;
                  auVar61._24_4_ = 0x7f800000;
                  auVar61._28_4_ = 0x7f800000;
                  auVar36 = vblendmps_avx512vl(auVar61,auVar63._0_32_);
                  auVar59._0_4_ =
                       (uint)(bVar23 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar59._4_4_ = (uint)bVar9 * auVar36._4_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar59._8_4_ = (uint)bVar9 * auVar36._8_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
                  auVar59._12_4_ = (uint)bVar9 * auVar36._12_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar34 >> 4) & 1);
                  auVar59._16_4_ = (uint)bVar9 * auVar36._16_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar34 >> 5) & 1);
                  auVar59._20_4_ = (uint)bVar9 * auVar36._20_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar34 >> 6) & 1);
                  auVar59._24_4_ = (uint)bVar9 * auVar36._24_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = SUB81(uVar34 >> 7,0);
                  auVar59._28_4_ = (uint)bVar9 * auVar36._28_4_ | (uint)!bVar9 * 0x7f800000;
                  auVar36 = vshufps_avx(auVar59,auVar59,0xb1);
                  auVar36 = vminps_avx(auVar59,auVar36);
                  auVar37 = vshufpd_avx(auVar36,auVar36,5);
                  auVar36 = vminps_avx(auVar36,auVar37);
                  auVar37 = vpermpd_avx2(auVar36,0x4e);
                  auVar36 = vminps_avx(auVar36,auVar37);
                  uVar12 = vcmpps_avx512vl(auVar59,auVar36,0);
                  bVar23 = (byte)uVar12 & bVar23;
                  uVar28 = (uint)uVar34;
                  if (bVar23 != 0) {
                    uVar28 = (uint)bVar23;
                  }
                  uVar27 = 0;
                  for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                    uVar27 = uVar27 + 1;
                  }
                } while( true );
              }
            }
          }
          local_2818 = local_2818 + 1;
        } while (local_2818 != local_2828);
      }
      uVar70 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar63 = ZEXT3264(CONCAT428(uVar70,CONCAT424(uVar70,CONCAT420(uVar70,CONCAT416(uVar70,
                                                  CONCAT412(uVar70,CONCAT48(uVar70,CONCAT44(uVar70,
                                                  uVar70))))))));
      auVar94 = ZEXT3264(local_2600);
      auVar95 = ZEXT3264(_DAT_01fe9900);
      auVar97 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      fVar71 = local_25a0;
      fVar73 = fStack_259c;
      fVar74 = fStack_2598;
      fVar75 = fStack_2594;
      fVar76 = fStack_2590;
      fVar77 = fStack_258c;
      fVar78 = fStack_2588;
      fVar79 = local_25c0;
      fVar81 = fStack_25bc;
      fVar82 = fStack_25b8;
      fVar83 = fStack_25b4;
      fVar84 = fStack_25b0;
      fVar85 = fStack_25ac;
      fVar86 = fStack_25a8;
      fVar87 = local_25e0;
      fVar88 = fStack_25dc;
      fVar89 = fStack_25d8;
      fVar90 = fStack_25d4;
      fVar91 = fStack_25d0;
      fVar92 = fStack_25cc;
      fVar93 = fStack_25c8;
    }
LAB_007a0c85:
    if (local_2880 == &local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }